

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::_::ArrayJoinPromiseNodeBase::Branch>::~Array
          (Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this)

{
  Array<kj::_::ArrayJoinPromiseNodeBase::Branch> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }